

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

bool leccalc::setupoutputfiles
               (FILE **fout,bool ordFlag,bool *outputFlags,bool skipheader,
               vector<int,_std::allocator<int>_> *fileIDs_occ,
               vector<int,_std::allocator<int>_> *fileIDs_agg,aggreports *agg)

{
  iterator iVar1;
  FILE **ppFVar2;
  FILE *__stream;
  size_t sVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  pointer piVar5;
  int *piVar6;
  undefined7 in_register_00000031;
  byte bVar7;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  string fileHeader_ept;
  string fileHeader_psept;
  vector<int,_std::allocator<int>_> fileIDs;
  vector<int,_std::allocator<int>_> handles_psept;
  vector<int,_std::allocator<int>_> handles_occ;
  vector<int,_std::allocator<int>_> handles_agg;
  vector<int,_std::allocator<int>_> local_108;
  FILE **local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 local_a8 [16];
  int *local_98;
  int *piStack_90;
  undefined8 local_88;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_bc = (undefined4)CONCAT71(in_register_00000009,skipheader);
  local_e0 = (undefined1 *)0x200000000;
  local_d8 = CONCAT44(local_d8._4_4_,3);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_e0;
  local_e8 = fout;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,(allocator_type *)&local_b8);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    piVar5 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if (outputFlags[*piVar5] == true) {
        iVar1._M_current =
             (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          bVar4 = true;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)fileIDs_agg,iVar1,piVar5);
        }
        else {
          *iVar1._M_current = *piVar5;
          (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          bVar4 = true;
        }
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (((ordFlag) &&
      (iVar1._M_current =
            (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start,
      (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != iVar1._M_current)) &&
     ((fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current, *local_e8 != (FILE *)0x0)) {
    local_e0 = (undefined1 *)((ulong)local_e0 & 0xffffffff00000000);
    if (iVar1._M_current ==
        (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (fileIDs_agg,iVar1,(int *)&local_e0);
    }
    else {
      *iVar1._M_current = 0;
      (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current + 1;
    }
  }
  local_e0 = (undefined1 *)0x600000004;
  local_d8 = CONCAT44(local_d8._4_4_,7);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l_00,(allocator_type *)&local_b8);
  for (piVar5 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 != local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    if (outputFlags[*piVar5] == true) {
      iVar1._M_current =
           (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        bVar4 = true;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)fileIDs_occ,iVar1,piVar5);
      }
      else {
        *iVar1._M_current = *piVar5;
        (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar1._M_current + 1;
        bVar4 = true;
      }
    }
  }
  if (((ordFlag) &&
      (iVar1._M_current =
            (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start,
      (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != iVar1._M_current)) &&
     ((fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current, *local_e8 != (FILE *)0x0)) {
    local_e0 = (undefined1 *)((ulong)local_e0 & 0xffffffff00000000);
    if (iVar1._M_current ==
        (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (fileIDs_occ,iVar1,(int *)&local_e0);
    }
    else {
      *iVar1._M_current = 0;
      (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current + 1;
    }
  }
  local_c0 = (undefined4)CONCAT71(in_register_00000031,ordFlag);
  local_e0 = (undefined1 *)0x500000001;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l_01,(allocator_type *)&local_b8);
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  piVar6 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (outputFlags[*piVar6] == true) {
        if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,piVar6);
        }
        else {
          *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *piVar6;
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      piVar6 = piVar6 + 1;
    } while (piVar6 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  bVar7 = (byte)local_c0;
  if (((local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start & bVar7) != 0) &&
     (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, local_e8[1] != (FILE *)0x0)) {
    local_e0 = (undefined1 *)CONCAT44(local_e0._4_4_,1);
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,(int *)&local_e0);
    }
    else {
      *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = 1;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
    }
  }
  if (((long)(fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2) +
      ((long)(fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2) != 0) {
    if (bVar7 == 0) {
      aggreports::SetLegacyOutputFunc(agg,0);
    }
    else {
      aggreports::SetORDOutputFunc(agg,0);
    }
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (bVar7 == 0) {
      aggreports::SetLegacyOutputFunc(agg,1);
    }
    else {
      aggreports::SetORDOutputFunc(agg,1);
    }
  }
  if ((char)local_bc == '\0') {
    local_e0 = local_d0;
    local_d8 = 0;
    local_d0[0] = 0;
    local_b0 = (char *)0x0;
    local_a8[0] = 0;
    local_b8 = local_a8;
    if (bVar7 == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x111225);
      std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x111248);
      __stream = fopen("input/ensemble.bin","rb");
      if (__stream != (FILE *)0x0) {
        sVar3 = fread(&local_98,8,1,__stream);
        if (sVar3 != 0) {
          std::__cxx11::string::append((char *)&local_e0);
          std::__cxx11::string::append((char *)&local_b8);
        }
        fclose(__stream);
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x1111cf);
      std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x1111f9);
    }
    local_98 = (int *)0x0;
    piStack_90 = (int *)0x0;
    local_88 = 0;
    std::
    __set_union<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (fileIDs_agg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (fileIDs_occ->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    ppFVar2 = local_e8;
    piVar6 = local_98;
    if (local_98 != piStack_90) {
      do {
        fprintf((FILE *)ppFVar2[*piVar6],"%s\n",local_e0);
        piVar6 = piVar6 + 1;
      } while (piVar6 != piStack_90);
    }
    piVar6 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        fprintf((FILE *)ppFVar2[*piVar6],"%s\n",local_b8);
        piVar6 = piVar6 + 1;
      } while (piVar6 != local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_98 != (int *)0x0) {
      operator_delete(local_98);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

inline bool setupoutputfiles(FILE **fout, const bool ordFlag,
				     const bool *outputFlags,
				     const bool skipheader,
				     std::vector<int> &fileIDs_occ,
				     std::vector<int> &fileIDs_agg,
				     aggreports &agg)
	{
		bool hasEPT = false;

		// Get list of aggregate and occurrence output files
		const std::vector<int> handles_agg = { AGG_FULL_UNCERTAINTY,
						       AGG_SAMPLE_MEAN,
						       AGG_WHEATSHEAF_MEAN };
		getfileids(fout, handles_agg, ordFlag, outputFlags,
			   fileIDs_agg, hasEPT);

		const std::vector<int> handles_occ = { OCC_FULL_UNCERTAINTY,
						       OCC_SAMPLE_MEAN,
						       OCC_WHEATSHEAF_MEAN };
		getfileids(fout, handles_occ, ordFlag, outputFlags,
			   fileIDs_occ, hasEPT);

		const std::vector<int> handles_psept = { AGG_WHEATSHEAF,
							 OCC_WHEATSHEAF };
		std::vector<int> fileIDs_psept;
		for (auto it = handles_psept.begin(); it != handles_psept.end();
		     ++it) {
			if (outputFlags[*it]) fileIDs_psept.push_back(*it);
		}
		if (fileIDs_psept.size() > 0 && ordFlag) {
			fileIDs_psept.clear();
			if (fout[PSEPT] != nullptr)
				fileIDs_psept.push_back(PSEPT);
		}

		// Set write csv functions
		if ((fileIDs_occ.size() + fileIDs_agg.size()) > 0) {
			if (ordFlag) agg.SetORDOutputFunc(EPT);
			else agg.SetLegacyOutputFunc(EPT);
		}
		if (fileIDs_psept.size() > 0) {
			if (ordFlag) agg.SetORDOutputFunc(PSEPT);
			else agg.SetLegacyOutputFunc(PSEPT);
		}

		if (skipheader) return hasEPT;   // No header

		// Set file headers
		std::string fileHeader_ept;
		std::string fileHeader_psept;
		if (ordFlag) {
			fileHeader_ept = "SummaryId,EPCalc,EPType,ReturnPeriod,"
					 "Loss";
			fileHeader_psept = "SummaryId,SampleId,EPType,"
					   "ReturnPeriod,Loss";
		} else {
			fileHeader_ept = "summary_id,type,return_period,loss";
			fileHeader_psept = "summary_id,sidx,return_period,loss";
			FILE *fin = fopen(ENSEMBLE_FILE, "rb");
			if (fin != nullptr) {
				Ensemble e;
				// If there is at least one entry
				if (fread(&e, sizeof(Ensemble), 1, fin) != 0) {
					fileHeader_ept += ",ensemble_id";
					fileHeader_psept += ",ensemble_id";
				}
				fclose(fin);
			}
		}

		// Print headers for Exceedance Probability Table
		// (i.e. full uncertainty, sample mean and Wheatsheaf mean)
		std::vector<int> fileIDs;
		std::set_union(fileIDs_agg.begin(), fileIDs_agg.end(),
			       fileIDs_occ.begin(), fileIDs_occ.end(),
			       std::back_inserter(fileIDs));
		for (auto it = fileIDs.begin(); it != fileIDs.end(); ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_ept.c_str());
		}

		// Print headers for Per Sample Exceedance Probability Table
		// (i.e. Wheatsheaf)
		for (auto it = fileIDs_psept.begin(); it != fileIDs_psept.end();
		     ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_psept.c_str());
		}

		return hasEPT;
	}